

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletutil.h
# Opt level: O2

void wallet::WalletDescriptor::
     SerializationOps<DataStream,wallet::WalletDescriptor,ActionUnserialize>
               (WalletDescriptor *obj,DataStream *s)

{
  long in_FS_OFFSET;
  string descriptor_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  UnserializeMany<DataStream,std::__cxx11::string&,unsigned_long&,int&,int&,int&>
            (s,&local_30,&obj->creation_time,&obj->next_index,&obj->range_start,&obj->range_end);
  DeserializeDescriptor(obj,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(WalletDescriptor, obj)
    {
        std::string descriptor_str;
        SER_WRITE(obj, descriptor_str = obj.descriptor->ToString());
        READWRITE(descriptor_str, obj.creation_time, obj.next_index, obj.range_start, obj.range_end);
        SER_READ(obj, obj.DeserializeDescriptor(descriptor_str));
    }